

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManSetLutRefs(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (p->pLutRefs != (int *)0x0) {
    free(p->pLutRefs);
    p->pLutRefs = (int *)0x0;
  }
  piVar4 = (int *)calloc((long)p->nObjs,4);
  p->pLutRefs = piVar4;
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    lVar5 = 0;
    do {
      iVar1 = piVar3[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (piVar4 == (int *)0x0) {
LAB_0020c952:
        __assert_fail("p->pLutRefs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x25c,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
      }
      piVar4[(int)(iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff))] =
           piVar4[(int)(iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff))] + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar2->nSize);
  }
  iVar1 = p->nObjs;
  if (1 < (long)iVar1) {
    pVVar2 = p->vMapping;
    lVar5 = 1;
    do {
      if (pVVar2->nSize <= lVar5) {
LAB_0020c933:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = pVVar2->pArray;
      if (piVar3[lVar5] != 0) {
        lVar7 = (long)pVVar2->nSize;
        if (lVar7 <= lVar5) goto LAB_0020c933;
        lVar6 = 0;
        while( true ) {
          lVar8 = (long)piVar3[lVar5];
          if ((lVar8 < 0) || ((int)lVar7 <= piVar3[lVar5])) goto LAB_0020c933;
          if (piVar3[lVar8] <= lVar6) break;
          if (piVar4 == (int *)0x0) goto LAB_0020c952;
          piVar4[piVar3[lVar8 + lVar6 + 1]] = piVar4[piVar3[lVar8 + lVar6 + 1]] + 1;
          lVar6 = lVar6 + 1;
          lVar7 = (long)pVVar2->nSize;
          if (lVar7 <= lVar5) goto LAB_0020c933;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

void Gia_ManSetLutRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    ABC_FREE( p->pLutRefs );
    p->pLutRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjLutRefIncId( p, Gia_ObjFaninId0p(p, pObj) );
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_ObjLutRefIncId( p, iFan );
}